

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtouchhandler.cpp
# Opt level: O0

QRect __thiscall QEvdevTouchScreenData::screenGeometry(QEvdevTouchScreenData *this)

{
  bool bVar1;
  long lVar2;
  const_iterator o;
  QRect *in_RDI;
  long in_FS_OFFSET;
  QScreen *s;
  QList<QScreen_*> *__range3;
  QScreen *screen;
  QWindow *win;
  const_iterator __end3;
  const_iterator __begin3;
  QList<QScreen_*> screens;
  QScreen *in_stack_ffffffffffffff38;
  QRect *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  byte in_stack_ffffffffffffff4f;
  QRect *in_stack_ffffffffffffff58;
  QScreen *local_98;
  const_iterator local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined1 local_28 [16];
  QRect local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDI[0xc].x2.m_i & 1) == 0) {
    local_98 = (QScreen *)QGuiApplication::primaryScreen();
    bVar1 = QString::isEmpty((QString *)0x1135c1);
    if (!bVar1) {
      bVar1 = QPointer::operator_cast_to_bool((QPointer<QScreen> *)0x1135da);
      if (!bVar1) {
        local_40 = 0xaaaaaaaaaaaaaaaa;
        local_38 = 0xaaaaaaaaaaaaaaaa;
        local_30 = 0xaaaaaaaaaaaaaaaa;
        QGuiApplication::screens();
        local_48.i = (QScreen **)0xaaaaaaaaaaaaaaaa;
        local_48 = QList<QScreen_*>::begin((QList<QScreen_*> *)in_stack_ffffffffffffff40);
        o = QList<QScreen_*>::end((QList<QScreen_*> *)in_stack_ffffffffffffff40);
        while (bVar1 = QList<QScreen_*>::const_iterator::operator!=(&local_48,o), bVar1) {
          QList<QScreen_*>::const_iterator::operator*(&local_48);
          QScreen::name();
          in_stack_ffffffffffffff4f =
               operator==((QString *)in_stack_ffffffffffffff40,(QString *)in_stack_ffffffffffffff38)
          ;
          QString::~QString((QString *)0x1136de);
          if ((in_stack_ffffffffffffff4f & 1) != 0) {
            QPointer<QScreen>::operator=
                      ((QPointer<QScreen> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
            break;
          }
          QList<QScreen_*>::const_iterator::operator++(&local_48);
        }
        QList<QScreen_*>::~QList((QList<QScreen_*> *)0x113721);
      }
      bVar1 = QPointer::operator_cast_to_bool((QPointer<QScreen> *)0x113732);
      if (bVar1) {
        local_98 = QPointer::operator_cast_to_QScreen_((QPointer<QScreen> *)0x113749);
      }
    }
    if (local_98 == (QScreen *)0x0) {
      QRect::QRect(in_stack_ffffffffffffff40);
    }
    else {
      QScreen::geometry();
      local_18 = QHighDpi::toNativePixels<QRect,QScreen>
                           (in_RDI,(QScreen *)
                                   CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    }
  }
  else {
    lVar2 = QGuiApplication::focusWindow();
    if (lVar2 == 0) {
      QRect::QRect(in_stack_ffffffffffffff40);
    }
    else {
      local_28 = QWindow::geometry();
      local_18 = QHighDpi::toNativeWindowGeometry<QRect,QWindow>
                           (in_stack_ffffffffffffff58,(QWindow *)in_RDI);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_18;
}

Assistant:

QRect QEvdevTouchScreenData::screenGeometry() const
{
    if (m_forceToActiveWindow) {
        QWindow *win = QGuiApplication::focusWindow();
        return win ? QHighDpi::toNativeWindowGeometry(win->geometry(), win) : QRect();
    }

    // Now it becomes tricky. Traditionally we picked the primaryScreen()
    // and were done with it. But then, enter multiple screens, and
    // suddenly it was all broken.
    //
    // For now we only support the display configuration of the KMS/DRM
    // backends of eglfs. See QOutputMapping.
    //
    // The good news it that once winRect refers to the correct screen
    // geometry in the full virtual desktop space, there is nothing else
    // left to do since qguiapp will handle the rest.
    QScreen *screen = QGuiApplication::primaryScreen();
    if (!m_screenName.isEmpty()) {
        if (!m_screen) {
            const QList<QScreen *> screens = QGuiApplication::screens();
            for (QScreen *s : screens) {
                if (s->name() == m_screenName) {
                    m_screen = s;
                    break;
                }
            }
        }
        if (m_screen)
            screen = m_screen;
    }
    return screen ? QHighDpi::toNativePixels(screen->geometry(), screen) : QRect();
}